

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fse_decompress.cpp
# Opt level: O1

size_t duckdb_zstd::FSE_decompress_wksp_bmi2
                 (void *dst,size_t dstCapacity,void *cSrc,size_t cSrcSize,uint maxLog,
                 void *workSpace,size_t wkspSize,int bmi2)

{
  byte bVar1;
  ushort uVar2;
  FSE_DTable *pFVar3;
  void *pvVar4;
  int iVar5;
  int iVar6;
  size_t sVar7;
  undefined1 *puVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  long lVar12;
  ulong uVar13;
  ulong uVar14;
  size_t srcSize;
  ulong uVar15;
  undefined1 *puVar16;
  bool bVar17;
  FSE_DState_t state1;
  uint tableLog;
  BIT_DStream_t local_a8;
  FSE_DTable *local_80;
  long local_78;
  size_t local_70;
  FSE_DState_t local_68;
  FSE_DState_t local_58;
  uint local_48;
  uint local_44;
  void *local_40;
  undefined1 *local_38;
  
  if (bmi2 != 0) {
    sVar7 = FSE_decompress_wksp_body_bmi2(dst,dstCapacity,cSrc,cSrcSize,maxLog,workSpace,wkspSize);
    return sVar7;
  }
  local_48 = 0xff;
  if (wkspSize < 0x200) {
    return 0xffffffffffffffff;
  }
  bVar17 = false;
  local_70 = cSrcSize;
  local_40 = dst;
  sVar7 = FSE_readNCount_bmi2((short *)workSpace,&local_48,&local_44,cSrc,cSrcSize,0);
  if (sVar7 < 0xffffffffffffff89) {
    if (maxLog < local_44) {
      sVar7 = 0xffffffffffffffd4;
      bVar17 = false;
    }
    else {
      cSrc = (void *)((long)cSrc + sVar7);
      local_70 = local_70 - sVar7;
      bVar17 = true;
    }
  }
  srcSize = local_70;
  if (!bVar17) {
    return sVar7;
  }
  lVar12 = (long)(1 << ((byte)local_44 & 0x1f));
  if (wkspSize <
      ((1L << ((byte)local_44 & 0x3f)) + (ulong)(local_48 + 1) * 2 + lVar12 * 4 + 0x13 &
      0xfffffffffffffffc) + 0x204) {
    return 0xffffffffffffffd4;
  }
  local_80 = (FSE_DTable *)((long)workSpace + 0x200);
  sVar7 = FSE_buildDTable_internal
                    (local_80,(short *)workSpace,local_48,local_44,local_80 + lVar12 + 1,
                     (wkspSize - (lVar12 * 4 + 4)) - 0x200);
  pvVar4 = local_40;
  pFVar3 = local_80;
  if (0xffffffffffffff88 < sVar7) {
    return sVar7;
  }
  local_78 = (long)local_40 + dstCapacity;
  local_38 = (undefined1 *)((long)local_40 + (dstCapacity - 3));
  if (*(short *)((long)workSpace + 0x202) == 0) {
    sVar7 = BIT_initDStream(&local_a8,cSrc,srcSize);
    pFVar3 = local_80;
    if (0xffffffffffffff88 < sVar7) {
      return sVar7;
    }
    FSE_initDState(&local_58,&local_a8,local_80);
    FSE_initDState(&local_68,&local_a8,pFVar3);
    puVar16 = (undefined1 *)((long)local_40 + 1);
    do {
      iVar5 = (int)local_a8.start;
      if (local_a8.bitsConsumed < 0x41) {
        if (local_a8.ptr < local_a8.limitPtr) {
          if (local_a8.ptr == local_a8.start) {
            bVar17 = false;
            goto LAB_0039c21f;
          }
          bVar17 = local_a8.start <=
                   (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3));
          uVar10 = (int)local_a8.ptr - iVar5;
          if (bVar17) {
            uVar10 = local_a8.bitsConsumed >> 3;
          }
          local_a8.bitsConsumed = local_a8.bitsConsumed + uVar10 * -8;
        }
        else {
          uVar10 = local_a8.bitsConsumed >> 3;
          local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
          bVar17 = true;
        }
        local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar10);
        local_a8.bitContainer = *(BitContainerType *)local_a8.ptr;
      }
      else {
        bVar17 = false;
        local_a8.ptr = (char *)&BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
      }
LAB_0039c21f:
      if ((local_38 <= puVar16 + -1) || (!bVar17)) goto LAB_0039c3fd;
      bVar1 = *(byte *)((long)local_58.table + local_58.state * 4 + 3);
      iVar5 = local_a8.bitsConsumed + bVar1;
      uVar15 = (ulong)*(ushort *)((long)local_58.table + local_58.state * 4);
      uVar14 = (-1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) &
               local_a8.bitContainer >> (-(char)iVar5 & 0x3fU);
      puVar16[-1] = *(undefined1 *)((long)local_58.table + local_58.state * 4 + 2);
      bVar1 = *(byte *)((long)local_68.table + local_68.state * 4 + 3);
      iVar5 = iVar5 + (uint)bVar1;
      uVar13 = (ulong)*(ushort *)((long)local_68.table + local_68.state * 4);
      uVar11 = (-1L << (bVar1 & 0x3f) ^ 0xffffffffffffffffU) &
               local_a8.bitContainer >> (-(char)iVar5 & 0x3fU);
      *puVar16 = *(undefined1 *)((long)local_68.table + local_68.state * 4 + 2);
      bVar1 = *(byte *)((long)local_58.table + uVar15 * 4 + uVar14 * 4 + 3);
      iVar5 = iVar5 + (uint)bVar1;
      local_58.state =
           (~(-1L << (bVar1 & 0x3f)) & local_a8.bitContainer >> (-(char)iVar5 & 0x3fU)) +
           (ulong)*(ushort *)((long)local_58.table + uVar15 * 4 + uVar14 * 4);
      puVar16[1] = *(undefined1 *)((long)local_58.table + uVar15 * 4 + uVar14 * 4 + 2);
      bVar1 = *(byte *)((long)local_68.table + uVar13 * 4 + uVar11 * 4 + 3);
      local_a8.bitsConsumed = iVar5 + (uint)bVar1;
      local_68.state =
           (~(-1L << (bVar1 & 0x3f)) &
           local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU)) +
           (ulong)*(ushort *)((long)local_68.table + uVar13 * 4 + uVar11 * 4);
      puVar16[2] = *(undefined1 *)((long)local_68.table + uVar13 * 4 + uVar11 * 4 + 2);
      puVar16 = puVar16 + 4;
    } while( true );
  }
  if (srcSize == 0) {
    local_a8.ptr = (char *)0x0;
    local_a8.start = (char *)0x0;
    local_a8.bitContainer = 0;
    local_a8.bitsConsumed = 0;
    local_a8._12_4_ = 0;
    local_a8.limitPtr = (char *)0x0;
    srcSize = 0xffffffffffffffb8;
  }
  else {
    local_a8.limitPtr = (char *)((long)cSrc + 8);
    local_a8.start = (char *)cSrc;
    if (srcSize < 8) {
      local_a8.bitContainer = (BitContainerType)(byte)*cSrc;
      switch(srcSize) {
      case 7:
        local_a8.bitContainer = (ulong)*(byte *)((long)cSrc + 6) << 0x30 | local_a8.bitContainer;
      case 6:
        local_a8.bitContainer = local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 5) << 0x28);
      case 5:
        local_a8.bitContainer = local_a8.bitContainer + ((ulong)*(byte *)((long)cSrc + 4) << 0x20);
      case 4:
        local_a8.bitContainer = local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 3) * 0x1000000
        ;
      case 3:
        local_a8.bitContainer = local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 2) * 0x10000;
      case 2:
        local_a8.bitContainer = local_a8.bitContainer + (ulong)*(byte *)((long)cSrc + 1) * 0x100;
      default:
        bVar1 = *(byte *)((long)cSrc + (srcSize - 1));
        uVar10 = 0x1f;
        if (bVar1 != 0) {
          for (; bVar1 >> uVar10 == 0; uVar10 = uVar10 - 1) {
          }
        }
        local_a8.bitsConsumed = ~uVar10 + 9;
        if (bVar1 == 0) {
          local_a8.bitsConsumed = 0;
        }
        local_a8.ptr = (char *)cSrc;
        if (bVar1 == 0) {
          srcSize = 0xffffffffffffffec;
        }
        else {
          local_a8.bitsConsumed = local_a8.bitsConsumed + (int)srcSize * -8 + 0x40;
        }
      }
    }
    else {
      local_a8.ptr = (char *)((long)cSrc + (srcSize - 8));
      local_a8.bitContainer = *(BitContainerType *)local_a8.ptr;
      bVar1 = *(byte *)((long)cSrc + (srcSize - 1));
      uVar10 = 0x1f;
      if (bVar1 != 0) {
        for (; bVar1 >> uVar10 == 0; uVar10 = uVar10 - 1) {
        }
      }
      local_a8.bitsConsumed = ~uVar10 + 9;
      if (bVar1 == 0) {
        local_a8.bitsConsumed = 0;
      }
      if (bVar1 == 0) {
        srcSize = 0xffffffffffffffff;
      }
    }
  }
  if (0xffffffffffffff88 < srcSize) {
    return srcSize;
  }
  FSE_initDState(&local_58,&local_a8,local_80);
  FSE_initDState(&local_68,&local_a8,pFVar3);
  puVar16 = (undefined1 *)((long)pvVar4 + 1);
  do {
    iVar5 = (int)local_a8.start;
    if (local_a8.bitsConsumed < 0x41) {
      if (local_a8.ptr < local_a8.limitPtr) {
        if (local_a8.ptr == local_a8.start) {
          bVar17 = false;
          goto LAB_0039c64e;
        }
        bVar17 = local_a8.start <=
                 (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3));
        uVar10 = (int)local_a8.ptr - iVar5;
        if (bVar17) {
          uVar10 = local_a8.bitsConsumed >> 3;
        }
        local_a8.bitsConsumed = local_a8.bitsConsumed + uVar10 * -8;
      }
      else {
        uVar10 = local_a8.bitsConsumed >> 3;
        local_a8.bitsConsumed = local_a8.bitsConsumed & 7;
        bVar17 = true;
      }
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar10);
      local_a8.bitContainer = *(BitContainerType *)local_a8.ptr;
    }
    else {
      bVar17 = false;
      local_a8.ptr = (char *)&BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    }
LAB_0039c64e:
    if ((local_38 <= puVar16 + -1) || (!bVar17)) goto LAB_0039c723;
    bVar1 = *(byte *)((long)local_58.table + local_58.state * 4 + 3);
    iVar5 = local_a8.bitsConsumed + bVar1;
    uVar11 = (local_a8.bitContainer << ((byte)local_a8.bitsConsumed & 0x3f)) >> (-bVar1 & 0x3f);
    uVar13 = (ulong)*(ushort *)((long)local_58.table + local_58.state * 4);
    puVar16[-1] = *(undefined1 *)((long)local_58.table + local_58.state * 4 + 2);
    bVar1 = *(byte *)((long)local_68.table + local_68.state * 4 + 3);
    iVar6 = iVar5 + (uint)bVar1;
    uVar15 = (local_a8.bitContainer << ((byte)iVar5 & 0x3f)) >> (-bVar1 & 0x3f);
    uVar14 = (ulong)*(ushort *)((long)local_68.table + local_68.state * 4);
    *puVar16 = *(undefined1 *)((long)local_68.table + local_68.state * 4 + 2);
    bVar1 = *(byte *)((long)local_58.table + uVar13 * 4 + uVar11 * 4 + 3);
    iVar5 = iVar6 + (uint)bVar1;
    local_58.state =
         ((local_a8.bitContainer << ((byte)iVar6 & 0x3f)) >> (-bVar1 & 0x3f)) +
         (ulong)*(ushort *)((long)local_58.table + uVar13 * 4 + uVar11 * 4);
    puVar16[1] = *(undefined1 *)((long)local_58.table + uVar13 * 4 + uVar11 * 4 + 2);
    bVar1 = *(byte *)((long)local_68.table + uVar14 * 4 + uVar15 * 4 + 3);
    local_a8.bitsConsumed = iVar5 + (uint)bVar1;
    local_68.state =
         ((local_a8.bitContainer << ((byte)iVar5 & 0x3f)) >> (-bVar1 & 0x3f)) +
         (ulong)*(ushort *)((long)local_68.table + uVar14 * 4 + uVar15 * 4);
    puVar16[2] = *(undefined1 *)((long)local_68.table + uVar14 * 4 + uVar15 * 4 + 2);
    puVar16 = puVar16 + 4;
  } while( true );
LAB_0039c3fd:
  do {
    puVar8 = puVar16;
    if ((undefined1 *)(local_78 - 2U) < puVar8 + -1) {
      return 0xffffffffffffffba;
    }
    uVar2 = *(ushort *)((long)local_58.table + local_58.state * 4);
    bVar1 = *(byte *)((long)local_58.table + local_58.state * 4 + 3);
    local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
    uVar13 = local_a8.bitContainer >> (-(char)local_a8.bitsConsumed & 0x3fU);
    puVar8[-1] = *(undefined1 *)((long)local_58.table + local_58.state * 4 + 2);
    uVar10 = local_a8.bitsConsumed;
    if (local_a8.bitsConsumed < 0x41) {
      if (local_a8.ptr < local_a8.limitPtr) {
        if (local_a8.ptr == local_a8.start) goto LAB_0039c4b2;
        uVar9 = (int)local_a8.ptr - iVar5;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
          uVar9 = local_a8.bitsConsumed >> 3;
        }
        uVar10 = local_a8.bitsConsumed + uVar9 * -8;
      }
      else {
        uVar9 = local_a8.bitsConsumed >> 3;
        uVar10 = local_a8.bitsConsumed & 7;
      }
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar9);
      local_a8.bitContainer = *(BitContainerType *)local_a8.ptr;
    }
    else {
      local_a8.ptr = (char *)&BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    }
LAB_0039c4b2:
    local_58.state = (uVar13 & ~(-1L << (bVar1 & 0x3f))) + (ulong)uVar2;
    if (0x40 < local_a8.bitsConsumed) {
      *puVar8 = *(undefined1 *)((long)local_68.table + local_68.state * 4 + 2);
      puVar16 = puVar8 + 1;
      goto LAB_0039ca0f;
    }
    if ((undefined1 *)(local_78 - 2U) < puVar8) {
      return 0xffffffffffffffba;
    }
    uVar2 = *(ushort *)((long)local_68.table + local_68.state * 4);
    bVar1 = *(byte *)((long)local_68.table + local_68.state * 4 + 3);
    uVar10 = uVar10 + bVar1;
    uVar13 = local_a8.bitContainer >> (-(char)uVar10 & 0x3fU);
    *puVar8 = *(undefined1 *)((long)local_68.table + local_68.state * 4 + 2);
    local_a8.bitsConsumed = uVar10;
    if (uVar10 < 0x41) {
      if (local_a8.ptr < local_a8.limitPtr) {
        if (local_a8.ptr == local_a8.start) goto LAB_0039c553;
        uVar9 = (int)local_a8.ptr - iVar5;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(uVar10 >> 3))) {
          uVar9 = uVar10 >> 3;
        }
        local_a8.bitsConsumed = uVar10 + uVar9 * -8;
      }
      else {
        uVar9 = uVar10 >> 3;
        local_a8.bitsConsumed = uVar10 & 7;
      }
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar9);
      local_a8.bitContainer = *(BitContainerType *)local_a8.ptr;
    }
    else {
      local_a8.ptr = (char *)&BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    }
LAB_0039c553:
    local_68.state = (uVar13 & ~(-1L << (bVar1 & 0x3f))) + (ulong)uVar2;
    puVar16 = puVar8 + 2;
  } while (uVar10 < 0x41);
  puVar8[1] = *(undefined1 *)((long)local_58.table + local_58.state * 4 + 2);
LAB_0039ca0f:
  return (long)puVar16 - (long)local_40;
LAB_0039c723:
  do {
    puVar8 = puVar16;
    if ((undefined1 *)(local_78 - 2U) < puVar8 + -1) {
      return 0xffffffffffffffba;
    }
    uVar2 = *(ushort *)((long)local_58.table + local_58.state * 4);
    bVar1 = *(byte *)((long)local_58.table + local_58.state * 4 + 3);
    uVar13 = local_a8.bitContainer << ((byte)local_a8.bitsConsumed & 0x3f);
    local_a8.bitsConsumed = local_a8.bitsConsumed + bVar1;
    puVar8[-1] = *(undefined1 *)((long)local_58.table + local_58.state * 4 + 2);
    uVar10 = local_a8.bitsConsumed;
    if (local_a8.bitsConsumed < 0x41) {
      if (local_a8.ptr < local_a8.limitPtr) {
        if (local_a8.ptr == local_a8.start) goto LAB_0039c7c4;
        uVar9 = (int)local_a8.ptr - iVar5;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(local_a8.bitsConsumed >> 3))) {
          uVar9 = local_a8.bitsConsumed >> 3;
        }
        uVar10 = local_a8.bitsConsumed + uVar9 * -8;
      }
      else {
        uVar9 = local_a8.bitsConsumed >> 3;
        uVar10 = local_a8.bitsConsumed & 7;
      }
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar9);
      local_a8.bitContainer = *(BitContainerType *)local_a8.ptr;
    }
    else {
      local_a8.ptr = (char *)&BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    }
LAB_0039c7c4:
    local_58.state = (uVar13 >> (-bVar1 & 0x3f)) + (ulong)uVar2;
    if (0x40 < local_a8.bitsConsumed) {
      *puVar8 = *(undefined1 *)((long)local_68.table + local_68.state * 4 + 2);
      puVar16 = puVar8 + 1;
      goto LAB_0039c930;
    }
    if ((undefined1 *)(local_78 - 2U) < puVar8) {
      return 0xffffffffffffffba;
    }
    uVar2 = *(ushort *)((long)local_68.table + local_68.state * 4);
    bVar1 = *(byte *)((long)local_68.table + local_68.state * 4 + 3);
    uVar13 = local_a8.bitContainer << ((byte)uVar10 & 0x3f);
    uVar10 = uVar10 + bVar1;
    *puVar8 = *(undefined1 *)((long)local_68.table + local_68.state * 4 + 2);
    local_a8.bitsConsumed = uVar10;
    if (uVar10 < 0x41) {
      if (local_a8.ptr < local_a8.limitPtr) {
        if (local_a8.ptr == local_a8.start) goto LAB_0039c843;
        uVar9 = (int)local_a8.ptr - iVar5;
        if (local_a8.start <= (ulong *)((long)local_a8.ptr - (ulong)(uVar10 >> 3))) {
          uVar9 = uVar10 >> 3;
        }
        local_a8.bitsConsumed = uVar10 + uVar9 * -8;
      }
      else {
        uVar9 = uVar10 >> 3;
        local_a8.bitsConsumed = uVar10 & 7;
      }
      local_a8.ptr = (char *)((long)local_a8.ptr - (ulong)uVar9);
      local_a8.bitContainer = *(BitContainerType *)local_a8.ptr;
    }
    else {
      local_a8.ptr = (char *)&BIT_reloadDStream(duckdb_zstd::BIT_DStream_t*)::zeroFilled;
    }
LAB_0039c843:
    local_68.state = (uVar13 >> (-bVar1 & 0x3f)) + (ulong)uVar2;
    puVar16 = puVar8 + 2;
  } while (uVar10 < 0x41);
  puVar8[1] = *(undefined1 *)((long)local_58.table + local_58.state * 4 + 2);
LAB_0039c930:
  return (long)puVar16 - (long)local_40;
}

Assistant:

size_t FSE_decompress_wksp_bmi2(void* dst, size_t dstCapacity, const void* cSrc, size_t cSrcSize, unsigned maxLog, void* workSpace, size_t wkspSize, int bmi2)
{
#if DYNAMIC_BMI2
    if (bmi2) {
        return FSE_decompress_wksp_body_bmi2(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
    }
#endif
    (void)bmi2;
    return FSE_decompress_wksp_body_default(dst, dstCapacity, cSrc, cSrcSize, maxLog, workSpace, wkspSize);
}